

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_forcestep(lua_State *L)

{
  global_State *g_00;
  undefined1 auVar1 [16];
  lu_mem lVar2;
  uint uVar3;
  long lVar4;
  l_mem debt;
  long lVar5;
  ulong uVar6;
  global_State *g;
  lu_mem estimate;
  long lVar7;
  
  g_00 = L->l_G;
  lVar5 = 0x7ffffffffffffffc;
  if (g_00->gckind == '\x02') {
    uVar6 = g_00->GCestimate;
    if (uVar6 == 0) {
      luaC_fullgc(L,0);
      lVar2 = g_00->GCdebt + g_00->totalbytes;
    }
    else {
      luaC_runtilstate(L,0x20);
      g_00->gcstate = '\0';
      lVar2 = 0;
      if (g_00->GCdebt + g_00->totalbytes <= (long)g_00->gcmajorinc * (uVar6 / 100)) {
        lVar2 = uVar6;
      }
    }
    g_00->GCestimate = lVar2;
    lVar4 = g_00->GCdebt + g_00->totalbytes;
    if ((long)g_00->gcpause <
        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ffffffffffffffc)) / SEXT816(lVar4 / 100),0)) {
      lVar5 = (lVar4 / 100) * (long)g_00->gcpause;
    }
  }
  else {
    uVar6 = 0x28;
    if (0x28 < g_00->gcstepmul) {
      uVar6 = (ulong)(uint)g_00->gcstepmul;
    }
    lVar4 = g_00->GCdebt / 200 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    lVar7 = lVar4 * uVar6;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ffffffffffffffc)) / auVar1,0) <= lVar4) {
      lVar7 = 0x7ffffffffffffffc;
    }
    do {
      lVar2 = singlestep(L);
      lVar7 = lVar7 - lVar2;
      if (lVar7 < -0x95f) break;
    } while (g_00->gcstate != '\x05');
    if (g_00->gcstate != '\x05') {
      debt = (lVar7 / (long)uVar6) * 200;
      goto LAB_0010a4e0;
    }
    lVar4 = (long)g_00->GCestimate / 100;
    if ((long)g_00->gcpause <
        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ffffffffffffffc)) / SEXT816(lVar4),0)) {
      lVar5 = lVar4 * g_00->gcpause;
    }
    lVar4 = g_00->GCdebt + g_00->totalbytes;
  }
  debt = lVar4 - lVar5;
LAB_0010a4e0:
  luaE_setdebt(g_00,debt);
  if (g_00->tobefnz != (GCObject *)0x0) {
    uVar3 = 0;
    do {
      if ((3 < uVar3) && (g_00->gcstate != '\x05')) {
        return;
      }
      GCTM(L,1);
      uVar3 = uVar3 + 1;
    } while (g_00->tobefnz != (GCObject *)0x0);
  }
  return;
}

Assistant:

void luaC_forcestep (lua_State *L) {
  global_State *g = G(L);
  int i;
  if (isgenerational(g)) generationalcollection(L);
  else incstep(L);
  /* run a few finalizers (or all of them at the end of a collect cycle) */
  for (i = 0; g->tobefnz && (i < GCFINALIZENUM || g->gcstate == GCSpause); i++)
    GCTM(L, 1);  /* call one finalizer */
}